

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableBeginRow(ImGuiTable *table)

{
  int *piVar1;
  float *pfVar2;
  int iVar3;
  ImGuiWindow *pIVar4;
  ImGuiTable *pIVar5;
  ImU32 IVar6;
  ImU32 IVar7;
  float fVar8;
  
  if (table->IsInsideRow != true) {
    pIVar4 = table->InnerWindow;
    piVar1 = &table->CurrentRow;
    *piVar1 = *piVar1 + 1;
    iVar3 = *piVar1;
    table->CurrentColumn = -1;
    table->RowBgColor[0] = 0x1000000;
    table->RowBgColor[1] = 0x1000000;
    table->RowCellDataCurrent = -1;
    table->IsInsideRow = true;
    fVar8 = table->RowPosY2;
    if ((iVar3 == 0) && ('\0' < table->FreezeRowsCount)) {
      fVar8 = (table->OuterRect).Min.y;
      (pIVar4->DC).CursorPos.y = fVar8;
    }
    table->RowPosY2 = fVar8;
    table->RowPosY1 = fVar8;
    table->RowTextBaseline = 0.0;
    table->RowIndentOffsetX = (pIVar4->DC).Indent.x - table->HostIndentX;
    (pIVar4->DC).PrevLineTextBaseOffset = 0.0;
    (pIVar4->DC).CursorMaxPos.y = fVar8;
    if ((table->field_0x98 & 1) != 0) {
      IVar6 = GetColorU32(0x2a,1.0);
      pIVar5 = GImGui->CurrentTable;
      pfVar2 = &(pIVar5->InnerClipRect).Max.y;
      if (pIVar5->RowPosY1 < *pfVar2 || pIVar5->RowPosY1 == *pfVar2) {
        IVar7 = 0;
        if (IVar6 != 0x1000000) {
          IVar7 = IVar6;
        }
        pIVar5->RowBgColor[0] = IVar7;
      }
      if (table->CurrentRow == 0) {
        table->IsUsingHeaders = true;
      }
    }
    return;
  }
  __assert_fail("!table->IsInsideRow",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui_tables.cpp"
                ,0x6ae,"void ImGui::TableBeginRow(ImGuiTable *)");
}

Assistant:

void ImGui::TableBeginRow(ImGuiTable* table)
{
    ImGuiWindow* window = table->InnerWindow;
    IM_ASSERT(!table->IsInsideRow);

    // New row
    table->CurrentRow++;
    table->CurrentColumn = -1;
    table->RowBgColor[0] = table->RowBgColor[1] = IM_COL32_DISABLE;
    table->RowCellDataCurrent = -1;
    table->IsInsideRow = true;

    // Begin frozen rows
    float next_y1 = table->RowPosY2;
    if (table->CurrentRow == 0 && table->FreezeRowsCount > 0)
        next_y1 = window->DC.CursorPos.y = table->OuterRect.Min.y;

    table->RowPosY1 = table->RowPosY2 = next_y1;
    table->RowTextBaseline = 0.0f;
    table->RowIndentOffsetX = window->DC.Indent.x - table->HostIndentX; // Lock indent
    window->DC.PrevLineTextBaseOffset = 0.0f;
    window->DC.CursorMaxPos.y = next_y1;

    // Making the header BG color non-transparent will allow us to overlay it multiple times when handling smooth dragging.
    if (table->RowFlags & ImGuiTableRowFlags_Headers)
    {
        TableSetBgColor(ImGuiTableBgTarget_RowBg0, GetColorU32(ImGuiCol_TableHeaderBg));
        if (table->CurrentRow == 0)
            table->IsUsingHeaders = true;
    }
}